

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginalTrek++.cpp
# Opt level: O2

void __thiscall IsoSpec::Marginal::Marginal(Marginal *this,Marginal *other)

{
  Conf piVar1;
  double *pdVar2;
  uint uVar3;
  
  this->_vptr_Marginal = (_func_int **)&PTR__Marginal_0012ead8;
  this->disowned = other->disowned;
  uVar3 = other->atomCnt;
  this->isotopeNo = other->isotopeNo;
  this->atomCnt = uVar3;
  pdVar2 = other->atom_masses;
  this->atom_lProbs = other->atom_lProbs;
  this->atom_masses = pdVar2;
  this->loggamma_nominator = other->loggamma_nominator;
  other->disowned = true;
  piVar1 = other->mode_conf;
  if (piVar1 != (Conf)0x0) {
    this->mode_lprob = other->mode_lprob;
  }
  this->mode_conf = piVar1;
  return;
}

Assistant:

Marginal::Marginal(Marginal&& other) :
disowned(other.disowned),
isotopeNo(other.isotopeNo),
atomCnt(other.atomCnt),
atom_lProbs(other.atom_lProbs),
atom_masses(other.atom_masses),
loggamma_nominator(other.loggamma_nominator)
{
    other.disowned = true;
    if(other.mode_conf == nullptr)
    {
        mode_conf = nullptr;
        // Deliberately not initializing mode_lprob. In this state other.mode_lprob is uninitialized too.
    }
    else
    {
        mode_conf = other.mode_conf;
        mode_lprob = other.mode_lprob;
    }
}